

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

int Gia_ManFindEqualFlop(Vec_Ptr_t *vFlops,int iFlop,int nFlopWords)

{
  int iVar1;
  void *__s2;
  void *__s1;
  int local_34;
  int i;
  uint *pTemp;
  uint *pFlop;
  int nFlopWords_local;
  int iFlop_local;
  Vec_Ptr_t *vFlops_local;
  
  __s2 = Vec_PtrEntry(vFlops,iFlop);
  local_34 = 0;
  while( true ) {
    if (iFlop <= local_34) {
      return -1;
    }
    __s1 = Vec_PtrEntry(vFlops,local_34);
    iVar1 = memcmp(__s1,__s2,(long)nFlopWords << 2);
    if (iVar1 == 0) break;
    local_34 = local_34 + 1;
  }
  return local_34;
}

Assistant:

int Gia_ManFindEqualFlop( Vec_Ptr_t * vFlops, int iFlop, int nFlopWords )
{
    unsigned * pFlop, * pTemp;
    int i;
    pFlop = (unsigned *)Vec_PtrEntry( vFlops, iFlop );
    Vec_PtrForEachEntryStop( unsigned *, vFlops, pTemp, i, iFlop )
        if ( !memcmp( pTemp, pFlop, sizeof(unsigned) * nFlopWords ) )
            return i;
    return -1;
}